

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Fd.cpp
# Opt level: O0

void w3Fd::static_cleanup(int fd)

{
  bool bVar1;
  int fd_local;
  
  bVar1 = static_valid(fd);
  if (bVar1) {
    close(fd);
  }
  return;
}

Assistant:

void w3Fd::static_cleanup (int fd)
{
    if (!static_valid (fd))
        return;
#if _WIN32
    _close (fd);
#else
    close (fd);
#endif
}